

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.h
# Opt level: O2

DominatorTreeNode * __thiscall
spvtools::opt::DominatorTree::GetTreeNode(DominatorTree *this,uint32_t id)

{
  iterator iVar1;
  DominatorTreeNode *pDVar2;
  uint32_t local_c;
  
  local_c = id;
  iVar1 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>,_std::_Select1st<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_>_>
          ::find(&(this->nodes_)._M_t,&local_c);
  pDVar2 = (DominatorTreeNode *)0x0;
  if ((_Rb_tree_header *)iVar1._M_node != &(this->nodes_)._M_t._M_impl.super__Rb_tree_header) {
    pDVar2 = (DominatorTreeNode *)&iVar1._M_node[1]._M_parent;
  }
  return pDVar2;
}

Assistant:

inline DominatorTreeNode* GetTreeNode(uint32_t id) {
    DominatorTreeNodeMap::iterator node_iter = nodes_.find(id);
    if (node_iter == nodes_.end()) {
      return nullptr;
    }
    return &node_iter->second;
  }